

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# securitycheck.c
# Opt level: O0

int ossl_rsa_check_key(OSSL_LIB_CTX *ctx,RSA *rsa,int operation)

{
  int iVar1;
  uint in_EDX;
  RSA *in_RSI;
  char *in_RDI;
  int protect;
  undefined4 uVar2;
  int line;
  
  uVar2 = 0;
  if (in_EDX == 0x10) {
    return 1;
  }
  if (in_EDX == 0x20) {
    return 1;
  }
  if (in_EDX == 0x40) goto LAB_004b32d8;
  if (in_EDX != 0x200) {
    if (in_EDX == 0x400) goto LAB_004b32d8;
    if (in_EDX != 0x1000) {
      if (in_EDX != 0x2000) {
        ERR_new();
        ERR_set_debug(in_RDI,(int)((ulong)in_RSI >> 0x20),(char *)CONCAT44(in_EDX,uVar2));
        ERR_set_error(0x39,0xc0103,"invalid operation: %d",(ulong)in_EDX);
        return 0;
      }
      goto LAB_004b32d8;
    }
  }
  uVar2 = 1;
LAB_004b32d8:
  iVar1 = RSA_test_flags(in_RSI,0xf000);
  line = (int)((ulong)in_RSI >> 0x20);
  if (iVar1 != 0x1000) {
    return 1;
  }
  ERR_new();
  ERR_set_debug(in_RDI,line,(char *)CONCAT44(in_EDX,uVar2));
  ERR_set_error(0x39,0xb2,"operation: %d",(ulong)in_EDX);
  return 0;
}

Assistant:

int ossl_rsa_check_key(OSSL_LIB_CTX *ctx, const RSA *rsa, int operation)
{
    int protect = 0;

    switch (operation) {
        case EVP_PKEY_OP_SIGN:
            protect = 1;
            /* fallthrough */
        case EVP_PKEY_OP_VERIFY:
            break;
        case EVP_PKEY_OP_ENCAPSULATE:
        case EVP_PKEY_OP_ENCRYPT:
            protect = 1;
            /* fallthrough */
        case EVP_PKEY_OP_VERIFYRECOVER:
        case EVP_PKEY_OP_DECAPSULATE:
        case EVP_PKEY_OP_DECRYPT:
            if (RSA_test_flags(rsa,
                               RSA_FLAG_TYPE_MASK) == RSA_FLAG_TYPE_RSASSAPSS) {
                ERR_raise_data(ERR_LIB_PROV,
                               PROV_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE,
                               "operation: %d", operation);
                return 0;
            }
            break;
        default:
            ERR_raise_data(ERR_LIB_PROV, ERR_R_INTERNAL_ERROR,
                           "invalid operation: %d", operation);
            return 0;
    }

#if !defined(OPENSSL_NO_FIPS_SECURITYCHECKS)
    if (ossl_securitycheck_enabled(ctx)) {
        int sz = RSA_bits(rsa);

        if (protect ? (sz < 2048) : (sz < 1024)) {
            ERR_raise_data(ERR_LIB_PROV, PROV_R_INVALID_KEY_LENGTH,
                           "operation: %d", operation);
            return 0;
        }
    }
#else
    /* make protect used */
    (void)protect;
#endif /* OPENSSL_NO_FIPS_SECURITYCHECKS */
    return 1;
}